

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxCues.cpp
# Opt level: O0

uint64 __thiscall libmatroska::KaxCues::GetTimecodePosition(KaxCues *this,uint64 aTimecode)

{
  KaxCuePoint *this_00;
  KaxCueTrackPositions *this_01;
  KaxCueTrackPositions *aTrack;
  KaxCuePoint *aPoint;
  uint64 aTimecode_local;
  KaxCues *this_local;
  
  this_00 = GetTimecodePoint(this,aTimecode);
  if (this_00 == (KaxCuePoint *)0x0) {
    this_local = (KaxCues *)0x0;
  }
  else {
    this_01 = KaxCuePoint::GetSeekPosition(this_00);
    if (this_01 == (KaxCueTrackPositions *)0x0) {
      this_local = (KaxCues *)0x0;
    }
    else {
      this_local = (KaxCues *)KaxCueTrackPositions::ClusterPosition(this_01);
    }
  }
  return (uint64)this_local;
}

Assistant:

uint64 KaxCues::GetTimecodePosition(uint64 aTimecode) const
{
  const KaxCuePoint * aPoint = GetTimecodePoint(aTimecode);
  if (aPoint == NULL)
    return 0;

  const KaxCueTrackPositions * aTrack = aPoint->GetSeekPosition();
  if (aTrack == NULL)
    return 0;

  return aTrack->ClusterPosition();
}